

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void UnlatchCVars(void)

{
  ECVarType type;
  uint uVar1;
  FBaseCVar *this;
  UCVarValue value;
  
  while (LatchedValues.Count != 0) {
    LatchedValues.Count = LatchedValues.Count - 1;
    this = LatchedValues.Array[LatchedValues.Count].Variable;
    value = LatchedValues.Array[LatchedValues.Count].Value;
    type = LatchedValues.Array[LatchedValues.Count].Type;
    uVar1 = this->Flags;
    this->Flags = uVar1 & 0xffffffeb;
    FBaseCVar::SetGenericRep(this,value,type);
    if (value.String != (char *)0x0 && type == CVAR_String) {
      operator_delete__(value.String);
    }
    this->Flags = uVar1;
  }
  return;
}

Assistant:

void UnlatchCVars (void)
{
	FLatchedValue var;

	while (LatchedValues.Pop (var))
	{
		DWORD oldflags = var.Variable->Flags;
		var.Variable->Flags &= ~(CVAR_LATCH | CVAR_SERVERINFO);
		var.Variable->SetGenericRep (var.Value, var.Type);
		if (var.Type == CVAR_String)
			delete[] var.Value.String;
		var.Variable->Flags = oldflags;
	}
}